

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_ostream.cpp
# Opt level: O2

void __thiscall pretty_ostream::error(pretty_ostream *this,string *message)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[1m");
  poVar1 = std::operator<<(poVar1,"\x1b[31m");
  poVar1 = std::operator<<(poVar1,"[Error] ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  poVar1 = std::operator<<(poVar1,"\x1b[0m");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void pretty_ostream::error(string message) {
    cout << BOLD << RED << "[Error] " << message << RESET << endl;
}